

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

aiNodeAnim * __thiscall
Assimp::FBX::FBXConverter::GenerateTranslationNodeAnim
          (FBXConverter *this,string *name,Model *param_2,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *curves,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,double *min_time,
          bool inverse)

{
  long lVar1;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> uVar2;
  __uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true> na_00;
  long lVar3;
  undefined8 *puVar4;
  LayerMap *pLVar5;
  ulong uVar6;
  pointer __p;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> na;
  
  pLVar5 = (LayerMap *)curves;
  na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)operator_new(0x438);
  *(undefined4 *)
   na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
   super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
   super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl = 0;
  *(char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4) = '\0';
  memset((char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                        _M_t.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                        super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 5),0x1b,0x3ff);
  *(aiQuatKey **)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418) = (aiQuatKey *)0x0;
  *(uint *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x420) = 0;
  *(undefined8 *)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x404) = 0;
  *(undefined8 *)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x40c) = 0;
  *(aiVectorKey **)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x428) = (aiVectorKey *)0x0;
  *(undefined8 *)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x430) = 0;
  uVar6 = name->_M_string_length;
  na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
       super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
       super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
  if (uVar6 < 0x400) {
    *(int *)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
            super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl = (int)uVar6;
    memcpy((char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4),
           (name->_M_dataplus)._M_p,uVar6);
    ((char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                    super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                    super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4))[uVar6] = '\0';
  }
  ConvertTranslationKeys
            (this,(aiNodeAnim *)
                  na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl,curves,pLVar5,start,stop,
             max_time,min_time);
  if ((inverse) &&
     (*(int *)((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                     _M_t.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                     super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x404) != 0)) {
    lVar3 = 0x10;
    uVar6 = 0;
    do {
      lVar1 = *(long *)((long)na._M_t.
                              super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                              .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x408);
      *(uint *)(lVar1 + -8 + lVar3) = *(uint *)(lVar1 + -8 + lVar3) ^ 0x80000000;
      *(uint *)(lVar1 + -4 + lVar3) = *(uint *)(lVar1 + -4 + lVar3) ^ 0x80000000;
      *(uint *)(lVar1 + lVar3) = *(uint *)(lVar1 + lVar3) ^ 0x80000000;
      uVar6 = uVar6 + 1;
      lVar3 = lVar3 + 0x18;
    } while (uVar6 < *(uint *)((long)na._M_t.
                                     super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                                     .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl +
                              0x404));
  }
  puVar4 = (undefined8 *)operator_new__(0x18);
  uVar2 = na;
  *puVar4 = 0;
  puVar4[1] = 0;
  *(undefined4 *)(puVar4 + 2) = 0;
  *(undefined8 **)
   ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x428) = puVar4;
  *(undefined4 *)
   ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x420) = 1;
  *puVar4 = 0;
  lVar3 = *(long *)((long)na._M_t.
                          super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x428);
  *(undefined8 *)(lVar3 + 8) = 0x3f8000003f800000;
  *(undefined4 *)(lVar3 + 0x10) = 0x3f800000;
  puVar4 = (undefined8 *)operator_new__(0x18);
  *puVar4 = 0;
  puVar4[1] = 0x3f800000;
  puVar4[2] = 0;
  *(undefined8 **)
   ((long)uVar2._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418) = puVar4;
  *(undefined4 *)
   ((long)uVar2._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x410) = 1;
  *puVar4 = 0;
  lVar3 = *(long *)((long)uVar2._M_t.
                          super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418);
  *(undefined8 *)(lVar3 + 8) = 0x3f800000;
  *(undefined8 *)(lVar3 + 0x10) = 0;
  na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)0x0;
  std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::~unique_ptr(&na);
  return (aiNodeAnim *)
         (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)
         uVar2._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
         super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
         super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
}

Assistant:

aiNodeAnim* FBXConverter::GenerateTranslationNodeAnim(const std::string& name,
            const Model& /*target*/,
            const std::vector<const AnimationCurveNode*>& curves,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time,
            bool inverse) {
            std::unique_ptr<aiNodeAnim> na(new aiNodeAnim());
            na->mNodeName.Set(name);

            ConvertTranslationKeys(na.get(), curves, layer_map, start, stop, max_time, min_time);

            if (inverse) {
                for (unsigned int i = 0; i < na->mNumPositionKeys; ++i) {
                    na->mPositionKeys[i].mValue *= -1.0f;
                }
            }

            // dummy scaling key
            na->mScalingKeys = new aiVectorKey[1];
            na->mNumScalingKeys = 1;

            na->mScalingKeys[0].mTime = 0.;
            na->mScalingKeys[0].mValue = aiVector3D(1.0f, 1.0f, 1.0f);

            // dummy rotation key
            na->mRotationKeys = new aiQuatKey[1];
            na->mNumRotationKeys = 1;

            na->mRotationKeys[0].mTime = 0.;
            na->mRotationKeys[0].mValue = aiQuaternion();

            return na.release();
        }